

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O1

void helicsPublicationPublishBoolean(HelicsPublication pub,HelicsBool val,HelicsError *err)

{
  HelicsPublication pvVar1;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (pub == (HelicsPublication)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001a8550;
    }
    else {
      pvVar1 = (HelicsPublication)0x0;
      if (*pub == -0x684eff5b) {
        pvVar1 = pub;
      }
      if (*pub == -0x684eff5b || err == (HelicsError *)0x0) goto LAB_001a8552;
    }
    err->error_code = -3;
    err->message = "The given publication object does not point to a valid object";
  }
LAB_001a8550:
  pvVar1 = (HelicsPublication)0x0;
LAB_001a8552:
  if (pvVar1 != (HelicsPublication)0x0) {
    helics::Publication::publish(*(Publication **)((long)pvVar1 + 0x18),val != 0);
  }
  return;
}

Assistant:

void helicsPublicationPublishBoolean(HelicsPublication pub, HelicsBool val, HelicsError* err)
{
    auto* pubObj = verifyPublication(pub, err);
    if (pubObj == nullptr) {
        return;
    }
    try {
        pubObj->pubPtr->publish((val != HELICS_FALSE));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}